

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_io_MappedFile.cpp
# Opt level: O2

bool __thiscall axl::io::MappedFile::setSize(MappedFile *this,uint64_t size)

{
  bool bVar1;
  BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> local_20;
  
  if ((this->m_dynamicViewMgr).m_viewList.
      super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
      .
      super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
      .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head == (ViewEntry *)0x0 &&
      (this->m_permanentViewMgr).m_viewList.
      super_OwningListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::io::MappedViewMgr::ViewEntry>_>
      .
      super_ListBase<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>,_axl::sl::Iterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ImplicitPtrCast<axl::io::MappedViewMgr::ViewEntry,_axl::sl::ListLink>_>_>
      .super_ListData<axl::io::MappedViewMgr::ViewEntry>.m_head == (ViewEntry *)0x0) {
    bVar1 = psx::File::setSize((File *)this,size);
    return bVar1;
  }
  err::ErrorRef::ErrorRef((ErrorRef *)&local_20,0x10);
  err::setError((ErrorRef *)&local_20);
  rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::~BufRef(&local_20);
  return false;
}

Assistant:

bool
MappedFile::setSize(uint64_t size) {
	if (!m_permanentViewMgr.isEmpty() ||
		!m_dynamicViewMgr.isEmpty()) {
		err::setError(err::SystemErrorCode_InvalidDeviceState);
		return false;
	}

	return m_file.setSize(size);
}